

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

bool __thiscall
moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
          (ConcurrentQueue<_zframe_t*,MyTraits> *this,consumer_token_t *token,_zframe_t **item)

{
  ProducerBase *pPVar1;
  bool bVar2;
  ConcurrentQueueProducerTypelessBase *pCVar3;
  uint32_t uVar4;
  ProducerBase *pPVar5;
  ProducerBase *this_00;
  
  if (((token->desiredProducer == (ConcurrentQueueProducerTypelessBase *)0x0) ||
      (token->lastKnownGlobalOffset != *(uint32_t *)(this + 0x260))) &&
     (bVar2 = ConcurrentQueue<_zframe_t_*,_MyTraits>::update_current_producer_after_rotation
                        ((ConcurrentQueue<_zframe_t_*,_MyTraits> *)this,token), !bVar2)) {
    return false;
  }
  bVar2 = ProducerBase::dequeue<_zframe_t*>((ProducerBase *)&token->currentProducer[-1].token,item);
  if (bVar2) {
    uVar4 = token->itemsConsumedFromCurrent + 1;
    token->itemsConsumedFromCurrent = uVar4;
    if (uVar4 == 0x100) {
      LOCK();
      *(int *)(this + 0x260) = *(int *)(this + 0x260) + 1;
      UNLOCK();
    }
  }
  else {
    pPVar1 = *(ProducerBase **)this;
    pCVar3 = token->currentProducer;
    this_00 = (ProducerBase *)&pCVar3->next[-1].token;
    if (pCVar3->next == (ConcurrentQueueProducerTypelessBase *)0x0) {
      this_00 = pPVar1;
    }
    while( true ) {
      pPVar5 = (ProducerBase *)&pCVar3[-1].token;
      if (pCVar3 == (ConcurrentQueueProducerTypelessBase *)0x0) {
        pPVar5 = (ProducerBase *)0x0;
      }
      if (this_00 == pPVar5) {
        return false;
      }
      bVar2 = ProducerBase::dequeue<_zframe_t*>(this_00,item);
      if (bVar2) break;
      pCVar3 = ((ConcurrentQueueProducerTypelessBase *)(this_00 + 8))->next;
      this_00 = (ProducerBase *)&pCVar3[-1].token;
      if (pCVar3 == (ConcurrentQueueProducerTypelessBase *)0x0) {
        this_00 = pPVar1;
      }
      pCVar3 = token->currentProducer;
    }
    token->currentProducer = (ConcurrentQueueProducerTypelessBase *)(this_00 + 8);
    token->itemsConsumedFromCurrent = 1;
  }
  return true;
}

Assistant:

bool try_dequeue(consumer_token_t& token, U& item)
	{
		// The idea is roughly as follows:
		// Every 256 items from one producer, make everyone rotate (increase the global offset) -> this means the highest efficiency consumer dictates the rotation speed of everyone else, more or less
		// If you see that the global offset has changed, you must reset your consumption counter and move to your designated place
		// If there's no items where you're supposed to be, keep moving until you find a producer with some items
		// If the global offset has not changed but you've run out of items to consume, move over from your current position until you find an producer with something in it
		
		if (token.desiredProducer == nullptr || token.lastKnownGlobalOffset != globalExplicitConsumerOffset.load(std::memory_order_relaxed)) {
			if (!update_current_producer_after_rotation(token)) {
				return false;
			}
		}
		
		// If there was at least one non-empty queue but it appears empty at the time
		// we try to dequeue from it, we need to make sure every queue's been tried
		if (static_cast<ProducerBase*>(token.currentProducer)->dequeue(item)) {
			if (++token.itemsConsumedFromCurrent == EXPLICIT_CONSUMER_CONSUMPTION_QUOTA_BEFORE_ROTATE) {
				globalExplicitConsumerOffset.fetch_add(1, std::memory_order_relaxed);
			}
			return true;
		}
		
		auto tail = producerListTail.load(std::memory_order_acquire);
		auto ptr = static_cast<ProducerBase*>(token.currentProducer)->next_prod();
		if (ptr == nullptr) {
			ptr = tail;
		}
		while (ptr != static_cast<ProducerBase*>(token.currentProducer)) {
			if (ptr->dequeue(item)) {
				token.currentProducer = ptr;
				token.itemsConsumedFromCurrent = 1;
				return true;
			}
			ptr = ptr->next_prod();
			if (ptr == nullptr) {
				ptr = tail;
			}
		}
		return false;
	}